

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall cmComputeTargetDepends::CollectTargets(cmComputeTargetDepends *this)

{
  cmGlobalGenerator *pcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  mapped_type_conflict *pmVar5;
  uint uVar6;
  pointer ppcVar7;
  cmGeneratorTarget *gt;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  key_type local_50;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_48;
  
  pcVar1 = this->GlobalGenerator;
  uVar6 = 0;
  while( true ) {
    ppcVar2 = (pcVar1->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(pcVar1->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar2 >> 3) <=
        (ulong)uVar6) break;
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_48,
               &ppcVar2[uVar6]->GeneratorTargets);
    for (ppcVar7 = local_48._M_impl.super__Vector_impl_data._M_start;
        ppcVar7 != local_48._M_impl.super__Vector_impl_data._M_finish; ppcVar7 = ppcVar7 + 1) {
      local_50 = *ppcVar7;
      ppcVar3 = (this->Targets).
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppcVar4 = (this->Targets).
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pmVar5 = std::
               map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
               ::operator[](&this->TargetIndex,&local_50);
      *pmVar5 = (mapped_type_conflict)((ulong)((long)ppcVar4 - (long)ppcVar3) >> 3);
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
                (&this->Targets,&local_50);
    }
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              (&local_48);
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectTargets()
{
  // Collect all targets from all generators.
  std::vector<cmLocalGenerator*> const& lgens =
    this->GlobalGenerator->GetLocalGenerators();
  for (unsigned int i = 0; i < lgens.size(); ++i) {
    const std::vector<cmGeneratorTarget*> targets =
      lgens[i]->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::const_iterator ti = targets.begin();
         ti != targets.end(); ++ti) {
      cmGeneratorTarget* gt = *ti;
      int index = static_cast<int>(this->Targets.size());
      this->TargetIndex[gt] = index;
      this->Targets.push_back(gt);
    }
  }
}